

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrContextUtil.cpp
# Opt level: O3

void sglr::drawQuadWithVaoBuffers(Context *ctx,deUint32 program,Vec3 *p0,Vec3 *p1)

{
  uint uVar1;
  uint uVar2;
  TestError *this;
  undefined4 in_register_00000034;
  deUint32 bufIDs [2];
  deUint32 vaoID;
  deUint16 indices [6];
  deUint32 ndxID;
  float coord [8];
  uint local_a4;
  uint local_a0;
  uint local_9c;
  undefined8 local_98;
  undefined4 local_90;
  uint local_8c;
  undefined8 local_88;
  float local_80;
  undefined4 local_7c;
  undefined4 local_78;
  undefined4 local_74;
  float local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  float local_60;
  undefined4 local_5c;
  undefined8 local_58;
  float local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_80 = p0->m_data[2];
  local_50 = p1->m_data[2];
  local_88 = *(undefined8 *)p0->m_data;
  local_70 = (local_80 + local_50) * 0.5;
  local_7c = 0x3f800000;
  local_78 = (undefined4)local_88;
  local_6c = 0x3f800000;
  local_64 = (undefined4)((ulong)local_88 >> 0x20);
  local_5c = 0x3f800000;
  local_58 = *(undefined8 *)p1->m_data;
  local_68 = (undefined4)local_58;
  local_74 = (undefined4)((ulong)local_58 >> 0x20);
  local_4c = 0x3f800000;
  local_38 = 0x3f800000;
  uStack_30 = 0x3f8000003f800000;
  local_48 = 0;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0x3f800000;
  local_98 = 0x2000200010000;
  local_90 = 0x30001;
  local_60 = local_70;
  uVar1 = (*ctx->_vptr_Context[0x59])(ctx,CONCAT44(in_register_00000034,program),"a_position");
  uVar2 = (*ctx->_vptr_Context[0x59])(ctx,(ulong)program,"a_coord");
  (*ctx->_vptr_Context[0x4c])(ctx,1,&local_9c);
  (*ctx->_vptr_Context[0x4b])(ctx,(ulong)local_9c);
  (*ctx->_vptr_Context[0x26])(ctx,2,&local_a4);
  (*ctx->_vptr_Context[0x76])(ctx);
  if (-1 < (int)uVar1) {
    (*ctx->_vptr_Context[0x25])(ctx,0x8892,(ulong)local_a4);
    (*ctx->_vptr_Context[0x28])(ctx,0x8892,0x40,&local_88,0x88e4);
    (*ctx->_vptr_Context[0x50])(ctx,(ulong)uVar1);
    (*ctx->_vptr_Context[0x4e])(ctx,(ulong)uVar1,4,0x1406,0,0,0);
    (*ctx->_vptr_Context[0x25])(ctx,0x8892,0);
    if (-1 < (int)uVar2) {
      (*ctx->_vptr_Context[0x25])(ctx,0x8892,(ulong)local_a0);
      (*ctx->_vptr_Context[0x28])(ctx,0x8892,0x20,&local_48,0x88e4);
      (*ctx->_vptr_Context[0x50])(ctx,(ulong)uVar2);
      (*ctx->_vptr_Context[0x4e])(ctx,(ulong)uVar2,2,0x1406,0,0,0);
      (*ctx->_vptr_Context[0x25])(ctx,0x8892,0);
    }
    (*ctx->_vptr_Context[0x26])(ctx,1,&local_8c);
    (*ctx->_vptr_Context[0x25])(ctx,0x8893,(ulong)local_8c);
    (*ctx->_vptr_Context[0x28])(ctx,0x8893,0xc,&local_98,0x88e4);
    (*ctx->_vptr_Context[0x6a])(ctx,4,6,0x1403,0);
    (*ctx->_vptr_Context[0x25])(ctx,0x8893,0);
    (*ctx->_vptr_Context[0x27])(ctx,1,&local_8c);
    (*ctx->_vptr_Context[0x27])(ctx,2,&local_a4);
    (*ctx->_vptr_Context[0x4d])(ctx,1,&local_9c);
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,"posLoc >= 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrContextUtil.cpp"
             ,0x4b);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void drawQuadWithVaoBuffers (sglr::Context& ctx, deUint32 program, const tcu::Vec3& p0, const tcu::Vec3& p1)
{
	// Vertex data.
	float hz = (p0.z() + p1.z()) * 0.5f;
	float position[] =
	{
		p0.x(), p0.y(), p0.z(),	1.0f,
		p0.x(), p1.y(), hz,		1.0f,
		p1.x(), p0.y(), hz,		1.0f,
		p1.x(), p1.y(), p1.z(),	1.0f
	};
	const float coord[] =
	{
		0.0f, 0.0f,
		0.0f, 1.0f,
		1.0f, 0.0f,
		1.0f, 1.0f
	};
	const deUint16		indices[]	= { 0, 1, 2, 2, 1, 3 };

	deInt32				posLoc		= ctx.getAttribLocation(program, "a_position");
	deInt32				coordLoc	= ctx.getAttribLocation(program, "a_coord");
	deUint32			vaoID;
	deUint32			bufIDs[2];

	ctx.genVertexArrays(1, &vaoID);
	ctx.bindVertexArray(vaoID);

	ctx.genBuffers(2, &bufIDs[0]);

	ctx.useProgram(program);
	TCU_CHECK(posLoc >= 0);
	{
		ctx.bindBuffer(GL_ARRAY_BUFFER, bufIDs[0]);
		ctx.bufferData(GL_ARRAY_BUFFER, DE_LENGTH_OF_ARRAY(position)*sizeof(float), &position[0], GL_STATIC_DRAW);

		ctx.enableVertexAttribArray(posLoc);
		ctx.vertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, 0);

		ctx.bindBuffer(GL_ARRAY_BUFFER, 0);
	}

	if (coordLoc >= 0)
	{
		ctx.bindBuffer(GL_ARRAY_BUFFER, bufIDs[1]);
		ctx.bufferData(GL_ARRAY_BUFFER, DE_LENGTH_OF_ARRAY(coord)*sizeof(float), &coord[0], GL_STATIC_DRAW);

		ctx.enableVertexAttribArray(coordLoc);
		ctx.vertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, 0);

		ctx.bindBuffer(GL_ARRAY_BUFFER, 0);
	}

	{
		deUint32 ndxID;
		ctx.genBuffers(1, &ndxID);

		ctx.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, ndxID);
		ctx.bufferData(GL_ELEMENT_ARRAY_BUFFER, DE_LENGTH_OF_ARRAY(indices)*sizeof(deUint16), &indices[0], GL_STATIC_DRAW);

		ctx.drawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(indices), GL_UNSIGNED_SHORT, 0);

		ctx.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);
		ctx.deleteBuffers(1, &ndxID);
	}

	ctx.deleteBuffers(2, &bufIDs[0]);
	ctx.deleteVertexArrays(1, &vaoID);
}